

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-terrain.cpp
# Opt level: O1

bool loadUpdateIndirectProgram
               (int programName,bool updateIndirectStruct,bool resetCounter1,bool resetCounter2,
               int updateOffset,int divideValue,int addValue)

{
  bool bVar1;
  GLenum GVar2;
  djg_program *program;
  size_t sVar3;
  char *str;
  char *str_00;
  char buf [1024];
  char local_438 [8];
  char acStack_430 [7];
  char acStack_429 [8];
  char acStack_421 [1009];
  
  program = (djg_program *)malloc(0x10);
  program->src = (char *)0x0;
  program->next = (djg_program *)0x0;
  fwrite("Loading {Update-Indirect-Program}\n",0x22,1,_stdout);
  fflush(_stdout);
  if (GLAD_GL_ARB_shader_atomic_counter_ops == 0) {
    if (GLAD_GL_AMD_shader_atomic_counter_ops == 0) goto LAB_001450c5;
    str = "#define ATOMIC_COUNTER_EXCHANGE_AMD 1\n";
    str_00 = "#extension GL_AMD_shader_atomic_counter_ops : require\n";
  }
  else {
    str = "#define ATOMIC_COUNTER_EXCHANGE_ARB 1\n";
    str_00 = "#extension GL_ARB_shader_atomic_counter_ops : require\n";
  }
  djgp_push_string(program,str_00);
  djgp_push_string(program,str);
LAB_001450c5:
  djgp_push_string(program,"#define UPDATE_INDIRECT_STRUCT %i\n",(ulong)updateIndirectStruct);
  djgp_push_string(program,"#define UPDATE_INDIRECT_RESET_COUNTER1 %i\n",(ulong)resetCounter1);
  djgp_push_string(program,"#define UPDATE_INDIRECT_RESET_COUNTER2 %i\n",(ulong)resetCounter2);
  djgp_push_string(program,"#define BUFFER_BINDING_INDIRECT_COMMAND %i\n",8);
  djgp_push_string(program,"#define BINDING_ATOMIC_COUNTER %i\n",0);
  djgp_push_string(program,"#define BINDING_ATOMIC_COUNTER2 %i\n",1);
  djgp_push_string(program,"#define UPDATE_INDIRECT_OFFSET %i\n",(ulong)(uint)updateOffset);
  djgp_push_string(program,"#define UPDATE_INDIRECT_VALUE_DIVIDE %i\n",(ulong)(uint)divideValue);
  djgp_push_string(program,"#define UPDATE_INDIRECT_VALUE_ADD %i\n",(ulong)(uint)addValue);
  strcpy(local_438,g_app.dir.shader);
  sVar3 = strlen(local_438);
  builtin_strncpy(local_438 + sVar3,"terrain_",8);
  builtin_strncpy(acStack_430 + sVar3,"updateIn",8);
  builtin_strncpy(acStack_429 + sVar3,"ndirect_",8);
  builtin_strncpy(acStack_421 + sVar3,"cs.glsl",8);
  djgp_push_file(program,local_438);
  bVar1 = djgp_to_gl(program,0x1c2,false,true,g_gl.programs + programName);
  if (bVar1) {
    djgp_release(program);
    GVar2 = (*glad_glGetError)();
    bVar1 = GVar2 == 0;
  }
  else {
    fwrite("=> Failure <=\n",0xe,1,_stdout);
    fflush(_stdout);
    djgp_release(program);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
loadUpdateIndirectProgram(
    int programName,
    bool updateIndirectStruct,
    bool resetCounter1,
    bool resetCounter2,
    int updateOffset,
    int divideValue,
    int addValue
) {
    djg_program *djp = djgp_create();
    GLuint *program = &g_gl.programs[programName];
    char buf[1024];

    LOG("Loading {Update-Indirect-Program}\n");
    if (GLAD_GL_ARB_shader_atomic_counter_ops) {
        djgp_push_string(djp, "#extension GL_ARB_shader_atomic_counter_ops : require\n");
        djgp_push_string(djp, "#define ATOMIC_COUNTER_EXCHANGE_ARB 1\n");
    } else if (GLAD_GL_AMD_shader_atomic_counter_ops) {
        djgp_push_string(djp, "#extension GL_AMD_shader_atomic_counter_ops : require\n");
        djgp_push_string(djp, "#define ATOMIC_COUNTER_EXCHANGE_AMD 1\n");
    }

    djgp_push_string(djp, "#define UPDATE_INDIRECT_STRUCT %i\n", updateIndirectStruct ? 1 : 0);
    djgp_push_string(djp, "#define UPDATE_INDIRECT_RESET_COUNTER1 %i\n", resetCounter1 ? 1 : 0);
    djgp_push_string(djp, "#define UPDATE_INDIRECT_RESET_COUNTER2 %i\n", resetCounter2 ? 1 : 0);

    djgp_push_string(djp, "#define BUFFER_BINDING_INDIRECT_COMMAND %i\n", BUFFER_DISPATCH_INDIRECT);
    djgp_push_string(djp, "#define BINDING_ATOMIC_COUNTER %i\n", BINDING_ATOMIC_COUNTER);
    djgp_push_string(djp, "#define BINDING_ATOMIC_COUNTER2 %i\n", BINDING_ATOMIC_COUNTER2);

    djgp_push_string(djp, "#define UPDATE_INDIRECT_OFFSET %i\n", updateOffset);
    djgp_push_string(djp, "#define UPDATE_INDIRECT_VALUE_DIVIDE %i\n", divideValue);
    djgp_push_string(djp, "#define UPDATE_INDIRECT_VALUE_ADD %i\n", addValue);

    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "terrain_updateIndirect_cs.glsl"));

    if (!djgp_to_gl(djp, 450, false, true, program)) {
        LOG("=> Failure <=\n");
        djgp_release(djp);

        return false;
    }
    djgp_release(djp);

    return (glGetError() == GL_NO_ERROR);
}